

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> * __thiscall
CGL::SceneObjects::SphereObject::get_primitives(SphereObject *this)

{
  Vector3D *o;
  double in_RSI;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *in_RDI;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>
  *primitives;
  vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *this_00;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  this_00 = in_RDI;
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  vector((vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_> *)
         0x11a0ee);
  o = (Vector3D *)operator_new(0x40);
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffffa8,(Vector3D *)((long)in_RSI + 0x10));
  Sphere::Sphere((Sphere *)in_stack_ffffffffffffffb0,(SphereObject *)in_stack_ffffffffffffffa8,o,
                 in_RSI);
  std::vector<CGL::SceneObjects::Primitive_*,_std::allocator<CGL::SceneObjects::Primitive_*>_>::
  push_back(this_00,(value_type *)in_RDI);
  return this_00;
}

Assistant:

std::vector<Primitive*> SphereObject::get_primitives() const {
  std::vector<Primitive*> primitives;
  primitives.push_back(new Sphere(this,o,r));
  return primitives;
}